

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse2::ArrayIntersectorK_1<4,_embree::sse2::InstanceIntersectorK<4>_>,_false>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  StackItemT<embree::NodeRefPtr<4>_> *pSVar1;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar2;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  StackItemT<embree::NodeRefPtr<4>_> SVar8;
  AccelData *pAVar9;
  long lVar10;
  undefined1 auVar11 [12];
  float fVar12;
  float fVar13;
  undefined4 in_EAX;
  uint uVar14;
  undefined4 uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  NodeRef nodeRef;
  Primitive *prim;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar27;
  bool bVar28;
  uint uVar29;
  uint uVar30;
  undefined1 auVar31 [12];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [12];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar67;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [12];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar78;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [12];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [12];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar105;
  float fVar106;
  float fVar115;
  undefined1 auVar107 [12];
  float fVar113;
  float fVar116;
  float fVar118;
  undefined1 auVar108 [16];
  float fVar114;
  float fVar117;
  float fVar119;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar120;
  float fVar125;
  float fVar126;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar127;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  Precalculations pre;
  vbool<4> valid_leaf;
  float local_1148;
  undefined4 local_1138;
  undefined4 uStack_1130;
  undefined1 local_10d8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  vfloat<4> fmin;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar52 [16];
  undefined1 auVar97 [16];
  
  auVar37._8_4_ = 0xffffffff;
  auVar37._0_8_ = 0xffffffffffffffff;
  auVar37._12_4_ = 0xffffffff;
  auVar69._0_4_ = -(uint)((valid_i->field_0).i[0] == -1);
  auVar69._4_4_ = -(uint)((valid_i->field_0).i[1] == -1);
  auVar69._8_4_ = -(uint)((valid_i->field_0).i[2] == -1);
  auVar69._12_4_ = -(uint)((valid_i->field_0).i[3] == -1);
  uVar14 = movmskps(in_EAX,auVar69);
  if (uVar14 == 0) {
    return;
  }
  pAVar9 = This->ptr;
  uVar21 = (ulong)(uVar14 & 0xff);
  auVar128 = *(undefined1 (*) [16])ray;
  auVar129 = *(undefined1 (*) [16])(ray + 0x10);
  auVar130 = *(undefined1 (*) [16])(ray + 0x20);
  fVar67 = *(float *)(ray + 0x40);
  fVar78 = *(float *)(ray + 0x44);
  fVar115 = *(float *)(ray + 0x48);
  fVar120 = *(float *)(ray + 0x4c);
  fVar105 = (float)DAT_01f4bd50;
  fVar113 = DAT_01f4bd50._4_4_;
  fVar116 = DAT_01f4bd50._8_4_;
  fVar118 = DAT_01f4bd50._12_4_;
  auVar49._0_4_ = (uint)fVar67 & -(uint)(fVar105 <= ABS(fVar67));
  auVar49._4_4_ = (uint)fVar78 & -(uint)(fVar113 <= ABS(fVar78));
  auVar49._8_4_ = (uint)fVar115 & -(uint)(fVar116 <= ABS(fVar115));
  auVar49._12_4_ = (uint)fVar120 & -(uint)(fVar118 <= ABS(fVar120));
  auVar88._0_4_ = ~-(uint)(fVar105 <= ABS(fVar67)) & (uint)fVar105;
  auVar88._4_4_ = ~-(uint)(fVar113 <= ABS(fVar78)) & (uint)fVar113;
  auVar88._8_4_ = ~-(uint)(fVar116 <= ABS(fVar115)) & (uint)fVar116;
  auVar88._12_4_ = ~-(uint)(fVar118 <= ABS(fVar120)) & (uint)fVar118;
  auVar88 = auVar88 | auVar49;
  fVar125 = *(float *)(ray + 0x50);
  fVar126 = *(float *)(ray + 0x54);
  fVar127 = *(float *)(ray + 0x58);
  fVar5 = *(float *)(ray + 0x5c);
  auVar71._0_4_ = (uint)fVar125 & -(uint)(fVar105 <= ABS(fVar125));
  auVar71._4_4_ = (uint)fVar126 & -(uint)(fVar113 <= ABS(fVar126));
  auVar71._8_4_ = (uint)fVar127 & -(uint)(fVar116 <= ABS(fVar127));
  auVar71._12_4_ = (uint)fVar5 & -(uint)(fVar118 <= ABS(fVar5));
  auVar99._0_4_ = ~-(uint)(fVar105 <= ABS(fVar125)) & (uint)fVar105;
  auVar99._4_4_ = ~-(uint)(fVar113 <= ABS(fVar126)) & (uint)fVar113;
  auVar99._8_4_ = ~-(uint)(fVar116 <= ABS(fVar127)) & (uint)fVar116;
  auVar99._12_4_ = ~-(uint)(fVar118 <= ABS(fVar5)) & (uint)fVar118;
  auVar99 = auVar99 | auVar71;
  fVar6 = *(float *)(ray + 0x60);
  fVar7 = *(float *)(ray + 100);
  fVar12 = *(float *)(ray + 0x68);
  fVar13 = *(float *)(ray + 0x6c);
  auVar121._0_4_ = (uint)fVar6 & -(uint)(fVar105 <= ABS(fVar6));
  auVar121._4_4_ = (uint)fVar7 & -(uint)(fVar113 <= ABS(fVar7));
  auVar121._8_4_ = (uint)fVar12 & -(uint)(fVar116 <= ABS(fVar12));
  auVar121._12_4_ = (uint)fVar13 & -(uint)(fVar118 <= ABS(fVar13));
  auVar80._0_4_ = ~-(uint)(fVar105 <= ABS(fVar6)) & (uint)fVar105;
  auVar80._4_4_ = ~-(uint)(fVar113 <= ABS(fVar7)) & (uint)fVar113;
  auVar80._8_4_ = ~-(uint)(fVar116 <= ABS(fVar12)) & (uint)fVar116;
  auVar80._12_4_ = ~-(uint)(fVar118 <= ABS(fVar13)) & (uint)fVar118;
  auVar80 = auVar80 | auVar121;
  auVar108 = rcpps(_DAT_01f4bd50,auVar88);
  fVar131 = auVar108._0_4_;
  auVar91._0_4_ = auVar88._0_4_ * fVar131;
  fVar132 = auVar108._4_4_;
  auVar91._4_4_ = auVar88._4_4_ * fVar132;
  fVar133 = auVar108._8_4_;
  auVar91._8_4_ = auVar88._8_4_ * fVar133;
  fVar134 = auVar108._12_4_;
  auVar91._12_4_ = auVar88._12_4_ * fVar134;
  fVar131 = (1.0 - auVar91._0_4_) * fVar131 + fVar131;
  fVar132 = (1.0 - auVar91._4_4_) * fVar132 + fVar132;
  fVar133 = (1.0 - auVar91._8_4_) * fVar133 + fVar133;
  fVar134 = (1.0 - auVar91._12_4_) * fVar134 + fVar134;
  auVar108 = rcpps(auVar91,auVar99);
  fVar106 = auVar108._0_4_;
  fVar114 = auVar108._4_4_;
  fVar117 = auVar108._8_4_;
  fVar119 = auVar108._12_4_;
  fVar106 = (1.0 - auVar99._0_4_ * fVar106) * fVar106 + fVar106;
  fVar114 = (1.0 - auVar99._4_4_ * fVar114) * fVar114 + fVar114;
  fVar117 = (1.0 - auVar99._8_4_ * fVar117) * fVar117 + fVar117;
  fVar119 = (1.0 - auVar99._12_4_ * fVar119) * fVar119 + fVar119;
  auVar108 = rcpps(auVar108,auVar80);
  fVar105 = auVar108._0_4_;
  fVar113 = auVar108._4_4_;
  fVar116 = auVar108._8_4_;
  fVar118 = auVar108._12_4_;
  fVar105 = (1.0 - auVar80._0_4_ * fVar105) * fVar105 + fVar105;
  fVar113 = (1.0 - auVar80._4_4_ * fVar113) * fVar113 + fVar113;
  fVar116 = (1.0 - auVar80._8_4_ * fVar116) * fVar116 + fVar116;
  fVar118 = (1.0 - auVar80._12_4_ * fVar118) * fVar118 + fVar118;
  auVar83._0_12_ = ZEXT812(0);
  auVar83._12_4_ = 0;
  local_1098 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar83);
  auVar108._0_8_ = CONCAT44(-(uint)(fVar78 < 0.0),-(uint)(fVar67 < 0.0)) & 0x100000001;
  auVar108._8_4_ = -(uint)(fVar115 < 0.0) & 1;
  auVar108._12_4_ = -(uint)(fVar120 < 0.0) & 1;
  local_10a8 = maxps(*(undefined1 (*) [16])(ray + 0x80),auVar83);
  auVar60._0_8_ = CONCAT44(-(uint)(fVar126 < 0.0),-(uint)(fVar125 < 0.0)) & 0x200000002;
  auVar60._8_4_ = -(uint)(fVar127 < 0.0) & 2;
  auVar60._12_4_ = -(uint)(fVar5 < 0.0) & 2;
  auVar73._0_8_ = CONCAT44(-(uint)(fVar7 < 0.0),-(uint)(fVar6 < 0.0)) & 0x400000004;
  auVar73._8_4_ = -(uint)(fVar12 < 0.0) & 4;
  auVar73._12_4_ = -(uint)(fVar13 < 0.0) & 4;
  local_10b8 = auVar69 ^ auVar37 | auVar108 | auVar73 | auVar60;
  local_1038 = auVar128;
  local_1048 = auVar129;
  local_1058 = auVar130;
  local_1068 = fVar105;
  fStack_1064 = fVar113;
  fStack_1060 = fVar116;
  fStack_105c = fVar118;
  local_1078 = fVar131;
  fStack_1074 = fVar132;
  fStack_1070 = fVar133;
  fStack_106c = fVar134;
  local_1088 = fVar106;
  fStack_1084 = fVar114;
  fStack_1080 = fVar117;
  fStack_107c = fVar119;
LAB_00668b98:
  lVar10 = 0;
  if (uVar21 != 0) {
    for (; (uVar21 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
    }
  }
  iVar16 = *(int *)(local_10b8 + lVar10 * 4);
  auVar32._0_4_ = -(uint)(iVar16 == local_10b8._0_4_);
  auVar32._4_4_ = -(uint)(iVar16 == local_10b8._4_4_);
  auVar32._8_4_ = -(uint)(iVar16 == local_10b8._8_4_);
  auVar32._12_4_ = -(uint)(iVar16 == local_10b8._12_4_);
  uVar15 = movmskps((int)lVar10,auVar32);
  auVar60 = ~auVar32 & _DAT_01f45a30;
  auVar37 = local_1098 & auVar32 | auVar60;
  auVar49 = ~auVar32 & _DAT_01f45a40;
  auVar122 = local_10a8 & auVar32 | auVar49;
  auVar69 = auVar128 & auVar32 | auVar60;
  auVar81._4_4_ = auVar69._0_4_;
  auVar81._0_4_ = auVar69._4_4_;
  auVar81._8_4_ = auVar69._12_4_;
  auVar81._12_4_ = auVar69._8_4_;
  auVar69 = minps(auVar81,auVar69);
  auVar89._0_8_ = auVar69._8_8_;
  auVar89._8_4_ = auVar69._0_4_;
  auVar89._12_4_ = auVar69._4_4_;
  auVar88 = minps(auVar89,auVar69);
  auVar69 = auVar129 & auVar32 | auVar60;
  auVar100._4_4_ = auVar69._0_4_;
  auVar100._0_4_ = auVar69._4_4_;
  auVar100._8_4_ = auVar69._12_4_;
  auVar100._12_4_ = auVar69._8_4_;
  auVar69 = minps(auVar100,auVar69);
  auVar82._0_8_ = auVar69._8_8_;
  auVar82._8_4_ = auVar69._0_4_;
  auVar82._12_4_ = auVar69._4_4_;
  auVar83 = minps(auVar82,auVar69);
  auVar69 = auVar130 & auVar32 | auVar60;
  auVar101._4_4_ = auVar69._0_4_;
  auVar101._0_4_ = auVar69._4_4_;
  auVar101._8_4_ = auVar69._12_4_;
  auVar101._12_4_ = auVar69._8_4_;
  auVar69 = minps(auVar101,auVar69);
  auVar90._0_8_ = auVar69._8_8_;
  auVar90._8_4_ = auVar69._0_4_;
  auVar90._12_4_ = auVar69._4_4_;
  auVar91 = minps(auVar90,auVar69);
  auVar69 = auVar128 & auVar32 | auVar49;
  auVar92._4_4_ = auVar69._0_4_;
  auVar92._0_4_ = auVar69._4_4_;
  auVar92._8_4_ = auVar69._12_4_;
  auVar92._12_4_ = auVar69._8_4_;
  auVar69 = maxps(auVar92,auVar69);
  auVar38._0_8_ = auVar69._8_8_;
  auVar38._8_4_ = auVar69._0_4_;
  auVar38._12_4_ = auVar69._4_4_;
  auVar108 = maxps(auVar38,auVar69);
  auVar69 = auVar129 & auVar32 | auVar49;
  auVar93._4_4_ = auVar69._0_4_;
  auVar93._0_4_ = auVar69._4_4_;
  auVar93._8_4_ = auVar69._12_4_;
  auVar93._12_4_ = auVar69._8_4_;
  auVar69 = maxps(auVar93,auVar69);
  auVar70._0_8_ = auVar69._8_8_;
  auVar70._8_4_ = auVar69._0_4_;
  auVar70._12_4_ = auVar69._4_4_;
  auVar71 = maxps(auVar70,auVar69);
  auVar69 = auVar130 & auVar32 | auVar49;
  auVar39._4_4_ = auVar69._0_4_;
  auVar39._0_4_ = auVar69._4_4_;
  auVar39._8_4_ = auVar69._12_4_;
  auVar39._12_4_ = auVar69._8_4_;
  auVar69 = maxps(auVar39,auVar69);
  auVar72._0_8_ = auVar69._8_8_;
  auVar72._8_4_ = auVar69._0_4_;
  auVar72._12_4_ = auVar69._4_4_;
  auVar73 = maxps(auVar72,auVar69);
  auVar74._0_8_ = CONCAT44((uint)fVar132 & auVar32._4_4_,(uint)fVar131 & auVar32._0_4_);
  auVar74._8_4_ = (uint)fVar133 & auVar32._8_4_;
  auVar74._12_4_ = (uint)fVar134 & auVar32._12_4_;
  auVar84._8_4_ = auVar74._8_4_;
  auVar84._0_8_ = auVar74._0_8_;
  auVar84._12_4_ = auVar74._12_4_;
  auVar84 = auVar84 | auVar60;
  auVar109._4_4_ = auVar84._0_4_;
  auVar109._0_4_ = auVar84._4_4_;
  auVar109._8_4_ = auVar84._12_4_;
  auVar109._12_4_ = auVar84._8_4_;
  auVar99 = minps(auVar109,auVar84);
  auVar85._0_8_ = CONCAT44((uint)fVar114 & auVar32._4_4_,(uint)fVar106 & auVar32._0_4_);
  auVar85._8_4_ = (uint)fVar117 & auVar32._8_4_;
  auVar85._12_4_ = (uint)fVar119 & auVar32._12_4_;
  auVar94._8_4_ = auVar85._8_4_;
  auVar94._0_8_ = auVar85._0_8_;
  auVar94._12_4_ = auVar85._12_4_;
  auVar94 = auVar94 | auVar60;
  auVar102._4_4_ = auVar94._0_4_;
  auVar102._0_4_ = auVar94._4_4_;
  auVar102._8_4_ = auVar94._12_4_;
  auVar102._12_4_ = auVar94._8_4_;
  auVar80 = minps(auVar102,auVar94);
  auVar33._0_4_ = auVar32._0_4_ & (uint)fVar105;
  auVar33._4_4_ = auVar32._4_4_ & (uint)fVar113;
  auVar33._8_4_ = auVar32._8_4_ & (uint)fVar116;
  auVar33._12_4_ = auVar32._12_4_ & (uint)fVar118;
  auVar60 = auVar60 | auVar33;
  auVar95._4_4_ = auVar60._0_4_;
  auVar95._0_4_ = auVar60._4_4_;
  auVar95._8_4_ = auVar60._12_4_;
  auVar95._12_4_ = auVar60._8_4_;
  auVar69 = minps(auVar95,auVar60);
  auVar61._0_8_ = auVar69._8_8_;
  auVar61._8_4_ = auVar69._0_4_;
  auVar61._12_4_ = auVar69._4_4_;
  auVar69 = minps(auVar61,auVar69);
  auVar97._0_8_ = auVar99._0_8_;
  auVar97._8_4_ = auVar99._4_4_;
  auVar97._12_4_ = auVar80._4_4_;
  auVar96._8_8_ = auVar97._8_8_;
  auVar96._0_4_ = auVar99._0_4_;
  auVar96._4_4_ = auVar80._0_4_;
  auVar110._4_4_ = auVar80._8_4_;
  auVar110._0_4_ = auVar99._8_4_;
  auVar110._8_4_ = auVar99._12_4_;
  auVar110._12_4_ = auVar80._12_4_;
  auVar60 = minps(auVar110,auVar96);
  fVar67 = auVar69._0_4_;
  fVar78 = auVar60._0_4_;
  fVar115 = auVar60._4_4_;
  auVar74 = auVar74 | auVar49;
  auVar62._4_4_ = auVar74._0_4_;
  auVar62._0_4_ = auVar74._4_4_;
  auVar62._8_4_ = auVar74._12_4_;
  auVar62._12_4_ = auVar74._8_4_;
  auVar60 = maxps(auVar62,auVar74);
  auVar85 = auVar85 | auVar49;
  auVar75._4_4_ = auVar85._0_4_;
  auVar75._0_4_ = auVar85._4_4_;
  auVar75._8_4_ = auVar85._12_4_;
  auVar75._12_4_ = auVar85._8_4_;
  auVar80 = maxps(auVar75,auVar85);
  auVar33 = auVar33 | auVar49;
  auVar50._4_4_ = auVar33._0_4_;
  auVar50._0_4_ = auVar33._4_4_;
  auVar50._8_4_ = auVar33._12_4_;
  auVar50._12_4_ = auVar33._8_4_;
  auVar69 = maxps(auVar50,auVar33);
  auVar34._0_8_ = auVar69._8_8_;
  auVar34._8_4_ = auVar69._0_4_;
  auVar34._12_4_ = auVar69._4_4_;
  auVar69 = maxps(auVar34,auVar69);
  auVar52._0_8_ = auVar60._0_8_;
  auVar52._8_4_ = auVar60._4_4_;
  auVar52._12_4_ = auVar80._4_4_;
  auVar51._8_8_ = auVar52._8_8_;
  auVar51._0_4_ = auVar60._0_4_;
  auVar51._4_4_ = auVar80._0_4_;
  auVar63._4_4_ = auVar80._8_4_;
  auVar63._0_4_ = auVar60._8_4_;
  auVar63._8_4_ = auVar60._12_4_;
  auVar63._12_4_ = auVar80._12_4_;
  auVar60 = maxps(auVar63,auVar51);
  auVar40._4_4_ = auVar37._0_4_;
  auVar40._0_4_ = auVar37._4_4_;
  auVar40._8_4_ = auVar37._12_4_;
  auVar40._12_4_ = auVar37._8_4_;
  auVar49 = minps(auVar40,auVar37);
  auVar103._4_4_ = auVar122._0_4_;
  auVar103._0_4_ = auVar122._4_4_;
  auVar103._8_4_ = auVar122._12_4_;
  auVar103._12_4_ = auVar122._8_4_;
  auVar80 = maxps(auVar103,auVar122);
  local_10d8._8_8_ = auVar80._8_8_;
  local_10d8._0_8_ = local_10d8._8_8_;
  uVar14 = -(uint)(fVar78 < 0.0);
  uVar29 = -(uint)(fVar115 < 0.0);
  uVar30 = -(uint)(fVar67 < 0.0);
  auVar31._0_4_ = ~uVar14 & (uint)fVar78;
  auVar31._4_4_ = ~uVar29 & (uint)fVar115;
  auVar31._8_4_ = ~uVar30 & (uint)fVar67;
  auVar48._0_4_ = auVar60._0_4_ & uVar14;
  auVar48._4_4_ = auVar60._4_4_ & uVar29;
  auVar48._8_4_ = auVar69._0_4_ & uVar30;
  auVar48 = auVar48 | auVar31;
  auVar87._0_4_ = ~uVar14 & auVar88._0_4_;
  auVar87._4_4_ = ~uVar29 & auVar83._0_4_;
  auVar87._8_4_ = ~uVar30 & auVar91._0_4_;
  auVar68._0_4_ = auVar108._0_4_ & uVar14;
  auVar68._4_4_ = auVar71._0_4_ & uVar29;
  auVar68._8_4_ = auVar73._0_4_ & uVar30;
  auVar68 = auVar68 | auVar87;
  local_fa8 = auVar48._0_4_;
  local_f98 = auVar48._4_4_;
  local_fd8 = auVar48._8_4_;
  fStack_f94 = local_f98;
  fStack_f90 = local_f98;
  fStack_f8c = local_f98;
  uVar26 = (ulong)(local_f98 < 0.0) << 4 | 0x20;
  uVar23 = (ulong)(local_fd8 < 0.0) << 4 | 0x40;
  local_1148 = auVar80._0_4_;
  if (auVar80._8_4_ <= local_1148) {
    local_10d8._0_4_ = local_1148;
  }
  auVar107._0_4_ = (uint)fVar78 & uVar14;
  auVar107._4_4_ = (uint)fVar115 & uVar29;
  auVar107._8_4_ = (uint)fVar67 & uVar30;
  auVar79._0_4_ = ~uVar14 & auVar60._0_4_;
  auVar79._4_4_ = ~uVar29 & auVar60._4_4_;
  auVar79._8_4_ = ~uVar30 & auVar69._0_4_;
  auVar79 = auVar79 | auVar107;
  local_fb8 = (float)(auVar88._0_4_ & uVar14 | ~uVar14 & auVar108._0_4_) * local_fa8;
  local_fc8 = (float)(auVar83._0_4_ & uVar29 | ~uVar29 & auVar71._0_4_) * local_f98;
  fVar67 = (float)(auVar91._0_4_ & uVar30 | ~uVar30 & auVar73._0_4_) * local_fd8;
  local_fe8 = auVar79._0_4_;
  local_ff8 = auVar68._0_4_ * local_fe8;
  local_1008 = auVar79._4_4_;
  local_1018 = auVar68._4_4_ * local_1008;
  local_1028 = auVar79._8_4_;
  fVar78 = auVar68._8_4_ * local_1028;
  uVar25 = (ulong)(local_fa8 < 0.0) * 0x10;
  stack[0].ptr.ptr = *(size_t *)&pAVar9[1].bounds.bounds0.lower.field_0;
  stack[0].dist = 0;
  fStack_fa4 = local_fa8;
  fStack_fa0 = local_fa8;
  fStack_f9c = local_fa8;
  fStack_fb4 = local_fb8;
  fStack_fb0 = local_fb8;
  fStack_fac = local_fb8;
  fStack_fc4 = local_fc8;
  fStack_fc0 = local_fc8;
  fStack_fbc = local_fc8;
  fStack_fd4 = local_fd8;
  fStack_fd0 = local_fd8;
  fStack_fcc = local_fd8;
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  local_1138 = auVar49._0_4_;
  uStack_1130 = auVar49._8_4_;
  auVar41._4_4_ = local_1138;
  auVar41._0_4_ = local_1138;
  auVar41._8_4_ = local_1138;
  auVar41._12_4_ = local_1138;
  auVar35._4_4_ = uStack_1130;
  auVar35._0_4_ = uStack_1130;
  auVar35._8_4_ = uStack_1130;
  auVar35._12_4_ = uStack_1130;
  auVar69 = minps(auVar35,auVar41);
  fStack_1014 = local_1018;
  fStack_1010 = local_1018;
  fStack_100c = local_1018;
  fStack_1024 = local_1028;
  fStack_1020 = local_1028;
  fStack_101c = local_1028;
  pSVar27 = stack + 1;
LAB_00668f3d:
  auVar36._4_4_ = local_10d8._0_4_;
  auVar36._0_4_ = local_10d8._0_4_;
  auVar36._8_4_ = local_10d8._0_4_;
  auVar36._12_4_ = local_10d8._0_4_;
  do {
    if (pSVar27 == stack) {
      uVar21 = uVar21 & ~CONCAT44((int)((ulong)lVar10 >> 0x20),uVar15);
      if (uVar21 == 0) {
        return;
      }
      goto LAB_00668b98;
    }
    fVar115 = (float)pSVar27[-1].dist;
    pSVar27 = pSVar27 + -1;
    auVar42._4_4_ = fVar115;
    auVar42._0_4_ = fVar115;
    auVar42._8_4_ = fVar115;
    auVar42._12_4_ = fVar115;
    fVar120 = auVar122._0_4_;
    fVar125 = auVar122._4_4_;
    fVar126 = auVar122._8_4_;
    fVar127 = auVar122._12_4_;
    auVar53._4_4_ = -(uint)(fVar115 < fVar125);
    auVar53._0_4_ = -(uint)(fVar115 < fVar120);
    auVar53._8_4_ = -(uint)(fVar115 < fVar126);
    auVar53._12_4_ = -(uint)(fVar115 < fVar127);
    iVar16 = movmskps((int)stack,auVar53);
    if (iVar16 != 0) {
      uVar17 = (pSVar27->ptr).ptr;
      while( true ) {
        uVar14 = (uint)uVar17;
        if ((uVar17 & 8) != 0) {
          valid_leaf.field_0.i[1] = -(uint)(auVar42._4_4_ < fVar125);
          valid_leaf.field_0.i[0] = -(uint)(auVar42._0_4_ < fVar120);
          valid_leaf.field_0.i[2] = -(uint)(auVar42._8_4_ < fVar126);
          valid_leaf.field_0.i[3] = -(uint)(auVar42._12_4_ < fVar127);
          iVar16 = movmskps(uVar14,(undefined1  [16])valid_leaf.field_0);
          if (iVar16 != 0) {
            lVar20 = (ulong)(uVar14 & 0xf) - 8;
            prim = (Primitive *)(uVar17 & 0xfffffffffffffff0);
            while (bVar28 = lVar20 != 0, lVar20 = lVar20 + -1, bVar28) {
              valid_i = (vint<4> *)&valid_leaf;
              InstanceIntersectorK<4>::intersect((vbool<4> *)valid_i,&pre,ray,context,prim);
              prim = prim + 1;
              auVar128 = local_1038;
              auVar129 = local_1048;
              auVar130 = local_1058;
              fVar105 = local_1068;
              fVar113 = fStack_1064;
              fVar116 = fStack_1060;
              fVar118 = fStack_105c;
              fVar131 = local_1078;
              fVar132 = fStack_1074;
              fVar133 = fStack_1070;
              fVar134 = fStack_106c;
              fVar106 = local_1088;
              fVar114 = fStack_1084;
              fVar117 = fStack_1080;
              fVar119 = fStack_107c;
            }
            auVar58._0_4_ = -(uint)(*(float *)(ray + 0x80) < fVar120) & valid_leaf.field_0.i[0];
            auVar58._4_4_ = -(uint)(*(float *)(ray + 0x84) < fVar125) & valid_leaf.field_0.i[1];
            auVar58._8_4_ = -(uint)(*(float *)(ray + 0x88) < fVar126) & valid_leaf.field_0.i[2];
            auVar58._12_4_ = -(uint)(*(float *)(ray + 0x8c) < fVar127) & valid_leaf.field_0.i[3];
            iVar16 = movmskps((int)lVar20,auVar58);
            if (iVar16 != 0) {
              auVar46._0_4_ = (uint)*(float *)(ray + 0x80) & valid_leaf.field_0.i[0];
              auVar46._4_4_ = (uint)*(float *)(ray + 0x84) & valid_leaf.field_0.i[1];
              auVar46._8_4_ = (uint)*(float *)(ray + 0x88) & valid_leaf.field_0.i[2];
              auVar46._12_4_ = (uint)*(float *)(ray + 0x8c) & valid_leaf.field_0.i[3];
              auVar122._0_4_ = ~valid_leaf.field_0.i[0] & (uint)fVar120;
              auVar122._4_4_ = ~valid_leaf.field_0.i[1] & (uint)fVar125;
              auVar122._8_4_ = ~valid_leaf.field_0.i[2] & (uint)fVar126;
              auVar122._12_4_ = ~valid_leaf.field_0.i[3] & (uint)fVar127;
              auVar122 = auVar122 | auVar46;
              auVar47._4_4_ = auVar122._0_4_;
              auVar47._0_4_ = auVar122._4_4_;
              auVar47._8_4_ = auVar122._12_4_;
              auVar47._12_4_ = auVar122._8_4_;
              auVar108 = maxps(auVar47,auVar122);
              auVar11._4_8_ = auVar58._8_8_;
              auVar11._0_4_ = auVar108._4_4_;
              auVar59._0_8_ = auVar11._0_8_ << 0x20;
              auVar59._8_4_ = auVar108._8_4_;
              auVar59._12_4_ = auVar108._12_4_;
              local_10d8._8_8_ = auVar108._8_8_;
              local_10d8._0_8_ = auVar59._8_8_;
              if (auVar108._8_4_ <= auVar108._0_4_) {
                local_10d8._0_4_ = auVar108._0_4_;
              }
            }
          }
          goto LAB_00668f3d;
        }
        pfVar4 = (float *)(uVar17 + 0x20 + uVar25);
        auVar43._0_4_ = *pfVar4 * local_fa8 - local_fb8;
        auVar43._4_4_ = pfVar4[1] * fStack_fa4 - fStack_fb4;
        auVar43._8_4_ = pfVar4[2] * fStack_fa0 - fStack_fb0;
        auVar43._12_4_ = pfVar4[3] * fStack_f9c - fStack_fac;
        pfVar4 = (float *)(uVar17 + 0x20 + uVar26);
        auVar54._0_4_ = *pfVar4 * local_f98 - local_fc8;
        auVar54._4_4_ = pfVar4[1] * fStack_f94 - fStack_fc4;
        auVar54._8_4_ = pfVar4[2] * fStack_f90 - fStack_fc0;
        auVar54._12_4_ = pfVar4[3] * fStack_f8c - fStack_fbc;
        auVar108 = maxps(auVar43,auVar54);
        pfVar4 = (float *)(uVar17 + 0x20 + uVar23);
        auVar55._0_4_ = *pfVar4 * local_fd8 - fVar67;
        auVar55._4_4_ = pfVar4[1] * fStack_fd4 - fVar67;
        auVar55._8_4_ = pfVar4[2] * fStack_fd0 - fVar67;
        auVar55._12_4_ = pfVar4[3] * fStack_fcc - fVar67;
        auVar49 = maxps(auVar55,auVar69);
        fmin.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar108,auVar49);
        pfVar4 = (float *)(uVar17 + 0x20 + (uVar25 ^ 0x10));
        auVar56._0_4_ = *pfVar4 * local_fe8 - local_ff8;
        auVar56._4_4_ = pfVar4[1] * fStack_fe4 - fStack_ff4;
        auVar56._8_4_ = pfVar4[2] * fStack_fe0 - fStack_ff0;
        auVar56._12_4_ = pfVar4[3] * fStack_fdc - fStack_fec;
        pfVar4 = (float *)(uVar17 + 0x20 + (uVar26 ^ 0x10));
        auVar64._0_4_ = *pfVar4 * local_1008 - local_1018;
        auVar64._4_4_ = pfVar4[1] * fStack_1004 - fStack_1014;
        auVar64._8_4_ = pfVar4[2] * fStack_1000 - fStack_1010;
        auVar64._12_4_ = pfVar4[3] * fStack_ffc - fStack_100c;
        auVar108 = minps(auVar56,auVar64);
        pfVar4 = (float *)(uVar17 + 0x20 + (uVar23 ^ 0x10));
        auVar65._0_4_ = *pfVar4 * local_1028 - fVar78;
        auVar65._4_4_ = pfVar4[1] * fStack_1024 - fVar78;
        auVar65._8_4_ = pfVar4[2] * fStack_1020 - fVar78;
        auVar65._12_4_ = pfVar4[3] * fStack_101c - fVar78;
        auVar49 = minps(auVar65,auVar36);
        auVar108 = minps(auVar108,auVar49);
        auVar44._4_4_ = -(uint)(fmin.field_0._4_4_ <= auVar108._4_4_);
        auVar44._0_4_ = -(uint)(fmin.field_0._0_4_ <= auVar108._0_4_);
        auVar44._8_4_ = -(uint)(fmin.field_0._8_4_ <= auVar108._8_4_);
        auVar44._12_4_ = -(uint)(fmin.field_0._12_4_ <= auVar108._12_4_);
        uVar14 = movmskps(uVar14,auVar44);
        if (uVar14 == 0) break;
        uVar24 = (ulong)(uVar14 & 0xff);
        uVar22 = 0;
        uVar18 = 8;
        auVar42 = _DAT_01f45a30;
        do {
          lVar20 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
            }
          }
          fVar115 = *(float *)(uVar17 + 0x20 + lVar20 * 4);
          fVar5 = *(float *)(uVar17 + 0x30 + lVar20 * 4);
          fVar6 = *(float *)(uVar17 + 0x40 + lVar20 * 4);
          fVar7 = *(float *)(uVar17 + 0x50 + lVar20 * 4);
          auVar57._0_8_ =
               CONCAT44((fVar115 - auVar128._4_4_) * fVar132,(fVar115 - auVar128._0_4_) * fVar131);
          auVar57._8_4_ = (fVar115 - auVar128._8_4_) * fVar133;
          auVar57._12_4_ = (fVar115 - auVar128._12_4_) * fVar134;
          auVar66._0_8_ =
               CONCAT44((fVar6 - auVar129._4_4_) * fVar114,(fVar6 - auVar129._0_4_) * fVar106);
          auVar66._8_4_ = (fVar6 - auVar129._8_4_) * fVar117;
          auVar66._12_4_ = (fVar6 - auVar129._12_4_) * fVar119;
          fVar115 = *(float *)(uVar17 + 0x60 + lVar20 * 4);
          auVar98._0_8_ =
               CONCAT44((fVar115 - auVar130._4_4_) * fVar113,(fVar115 - auVar130._0_4_) * fVar105);
          auVar98._8_4_ = (fVar115 - auVar130._8_4_) * fVar116;
          auVar98._12_4_ = (fVar115 - auVar130._12_4_) * fVar118;
          auVar76._0_4_ = (fVar5 - auVar128._0_4_) * fVar131;
          auVar76._4_4_ = (fVar5 - auVar128._4_4_) * fVar132;
          auVar76._8_4_ = (fVar5 - auVar128._8_4_) * fVar133;
          auVar76._12_4_ = (fVar5 - auVar128._12_4_) * fVar134;
          auVar86._0_4_ = (fVar7 - auVar129._0_4_) * fVar106;
          auVar86._4_4_ = (fVar7 - auVar129._4_4_) * fVar114;
          auVar86._8_4_ = (fVar7 - auVar129._8_4_) * fVar117;
          auVar86._12_4_ = (fVar7 - auVar129._12_4_) * fVar119;
          fVar115 = *(float *)(uVar17 + 0x70 + lVar20 * 4);
          auVar104._0_4_ = (fVar115 - auVar130._0_4_) * fVar105;
          auVar104._4_4_ = (fVar115 - auVar130._4_4_) * fVar113;
          auVar104._8_4_ = (fVar115 - auVar130._8_4_) * fVar116;
          auVar104._12_4_ = (fVar115 - auVar130._12_4_) * fVar118;
          auVar111._8_4_ = auVar57._8_4_;
          auVar111._0_8_ = auVar57._0_8_;
          auVar111._12_4_ = auVar57._12_4_;
          auVar108 = minps(auVar111,auVar76);
          auVar123._8_4_ = auVar66._8_4_;
          auVar123._0_8_ = auVar66._0_8_;
          auVar123._12_4_ = auVar66._12_4_;
          auVar49 = minps(auVar123,auVar86);
          auVar108 = maxps(auVar108,auVar49);
          auVar124._8_4_ = auVar98._8_4_;
          auVar124._0_8_ = auVar98._0_8_;
          auVar124._12_4_ = auVar98._12_4_;
          auVar49 = minps(auVar124,auVar104);
          auVar60 = maxps(auVar108,auVar49);
          auVar108 = maxps(auVar57,auVar76);
          auVar49 = maxps(auVar66,auVar86);
          auVar108 = minps(auVar108,auVar49);
          auVar49 = maxps(auVar98,auVar104);
          auVar108 = minps(auVar108,auVar49);
          auVar49 = maxps(auVar60,auVar37);
          auVar108 = minps(auVar108,auVar122);
          auVar112._4_4_ = -(uint)(auVar49._4_4_ <= auVar108._4_4_);
          auVar112._0_4_ = -(uint)(auVar49._0_4_ <= auVar108._0_4_);
          auVar112._8_4_ = -(uint)(auVar49._8_4_ <= auVar108._8_4_);
          auVar112._12_4_ = -(uint)(auVar49._12_4_ <= auVar108._12_4_);
          uVar14 = movmskps((int)valid_i,auVar112);
          valid_i = (vint<4> *)(ulong)uVar14;
          uVar19 = uVar18;
          if (uVar14 != 0) {
            fVar115 = *(float *)((long)&stack[-1].ptr.ptr + lVar20 * 4);
            auVar108 = ZEXT416((uint)fVar115);
            uVar19 = *(ulong *)(uVar17 + lVar20 * 8);
            auVar77._4_4_ = -(uint)(fVar115 < auVar42._4_4_);
            auVar77._0_4_ = -(uint)(fVar115 < auVar42._0_4_);
            auVar77._8_4_ = -(uint)(fVar115 < auVar42._8_4_);
            auVar77._12_4_ = -(uint)(fVar115 < auVar42._12_4_);
            uVar14 = movmskps(uVar14,auVar77);
            valid_i = (vint<4> *)(ulong)uVar14;
            if (uVar14 == 0) {
              (pSVar27->ptr).ptr = uVar19;
              uVar19 = uVar18;
              auVar45 = auVar42;
            }
            else {
              if (uVar18 == 8) {
                auVar42._8_4_ = fVar115;
                auVar42._0_8_ = CONCAT44(fVar115,fVar115);
                auVar42._12_4_ = fVar115;
                goto LAB_00669159;
              }
              (pSVar27->ptr).ptr = uVar18;
              auVar45._8_4_ = fVar115;
              auVar45._0_8_ = CONCAT44(fVar115,fVar115);
              auVar45._12_4_ = fVar115;
              auVar108 = auVar42;
            }
            auVar42 = auVar45;
            uVar22 = uVar22 + 1;
            pSVar27->dist = auVar108._0_4_;
            pSVar27 = pSVar27 + 1;
          }
LAB_00669159:
          uVar24 = uVar24 & uVar24 - 1;
          uVar18 = uVar19;
        } while (uVar24 != 0);
        if (uVar19 == 8) break;
        uVar17 = uVar19;
        if (1 < uVar22) {
          pSVar1 = pSVar27 + -2;
          valid_leaf.field_0.v[2] = (float)pSVar27[-2].dist;
          pSVar2 = pSVar27 + -1;
          if ((uint)valid_leaf.field_0.v[2] < pSVar27[-1].dist) {
            SVar8 = *pSVar1;
            pSVar27[-2].dist = pSVar27[-1].dist;
            (pSVar1->ptr).ptr = (pSVar2->ptr).ptr;
            valid_leaf.field_0._0_8_ = SVar8.ptr.ptr;
            (pSVar2->ptr).ptr = valid_leaf.field_0._0_8_;
            valid_leaf.field_0.i[2] = SVar8.dist;
            pSVar27[-1].dist = (uint)valid_leaf.field_0.v[2];
          }
          valid_i = (vint<4> *)(ulong)(uint)valid_leaf.field_0.i[2];
          if (uVar22 != 2) {
            pSVar3 = pSVar27 + -3;
            uVar14 = pSVar27[-3].dist;
            if (uVar14 < pSVar27[-1].dist) {
              SVar8 = *pSVar3;
              pSVar27[-3].dist = pSVar27[-1].dist;
              (pSVar3->ptr).ptr = (pSVar2->ptr).ptr;
              valid_leaf.field_0._0_8_ = SVar8.ptr.ptr;
              (pSVar2->ptr).ptr = valid_leaf.field_0._0_8_;
              valid_leaf.field_0.i[2] = SVar8.dist;
              pSVar27[-1].dist = (uint)valid_leaf.field_0.v[2];
              uVar14 = pSVar27[-3].dist;
            }
            valid_i = (vint<4> *)(ulong)uVar14;
            if (uVar14 < pSVar27[-2].dist) {
              SVar8 = *pSVar3;
              pSVar27[-3].dist = pSVar27[-2].dist;
              (pSVar3->ptr).ptr = (pSVar1->ptr).ptr;
              valid_leaf.field_0._0_8_ = SVar8.ptr.ptr;
              (pSVar1->ptr).ptr = valid_leaf.field_0._0_8_;
              valid_leaf.field_0.i[2] = SVar8.dist;
              pSVar27[-2].dist = (uint)valid_leaf.field_0.v[2];
            }
          }
        }
      }
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersectCoherent(vint<K>* __restrict__ valid_i,
                                                                                                       Accel::Intersectors* __restrict__ This,
                                                                                                       RayHitK<K>& __restrict__ ray,
                                                                                                       RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *(float*)&stackPtr->dist;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active))) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            curDist = pos_inf;
            
#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const vfloat<K> childDist = fmin[i];
                const NodeRef child = node->child(i);
                BVHN<N>::prefetch(child);
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    stackPtr->ptr = cur;
                    *(float*)&stackPtr->dist = toScalar(curDist);
                    stackPtr++;
                  }
                  curDist = childDist;
                  cur = child;
                }
                /* push hit child onto stack */
                else {
                  num_child_hits++;
                  stackPtr->ptr = child;
                  *(float*)&stackPtr->dist = toScalar(childDist);
                  stackPtr++;
                }                
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;

            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (stackPtr[-2].dist < stackPtr[-1].dist)
                std::swap(stackPtr[-2],stackPtr[-1]);
              if (unlikely(num_child_hits >= 3))
              {
                if (stackPtr[-3].dist < stackPtr[-1].dist)
                  std::swap(stackPtr[-3],stackPtr[-1]);
                if (stackPtr[-3].dist < stackPtr[-2].dist)
                  std::swap(stackPtr[-3],stackPtr[-2]);
              }
            }
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);

          /* reduce max distance interval on successful intersection */
          if (likely(any((ray.tfar < tray.tfar) & valid_leaf)))
          {
            tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);
            frustum.template updateMaxDist<K>(tray.tfar);
          }

          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        
      } while(valid_bits);
    }